

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_scaling_square.c
# Opt level: O0

int16_t WebRtcSpl_GetScalingSquare(int16_t *in_vector,size_t in_vector_length,size_t times)

{
  int16_t iVar1;
  int16_t iVar2;
  short local_5c;
  size_t looptimes;
  int16_t *piStack_48;
  int16_t t;
  int16_t *sptr;
  int16_t sabs;
  size_t sStack_38;
  int16_t smax;
  size_t i;
  int16_t nbits;
  size_t times_local;
  size_t in_vector_length_local;
  int16_t *in_vector_local;
  
  iVar1 = WebRtcSpl_GetSizeInBits((uint32_t)times);
  sptr._6_2_ = -1;
  piStack_48 = in_vector;
  for (sStack_38 = in_vector_length; sStack_38 != 0; sStack_38 = sStack_38 - 1) {
    if (*piStack_48 < 1) {
      local_5c = -*piStack_48;
    }
    else {
      local_5c = *piStack_48;
    }
    piStack_48 = piStack_48 + 1;
    if (sptr._6_2_ < local_5c) {
      sptr._6_2_ = local_5c;
    }
  }
  iVar2 = WebRtcSpl_NormW32((int)sptr._6_2_ * (int)sptr._6_2_);
  if (sptr._6_2_ == 0) {
    in_vector_local._6_2_ = 0;
  }
  else if (iVar1 < iVar2) {
    in_vector_local._6_2_ = 0;
  }
  else {
    in_vector_local._6_2_ = iVar1 - iVar2;
  }
  return in_vector_local._6_2_;
}

Assistant:

int16_t WebRtcSpl_GetScalingSquare(int16_t* in_vector,
                                   size_t in_vector_length,
                                   size_t times)
{
    int16_t nbits = WebRtcSpl_GetSizeInBits((uint32_t)times);
    size_t i;
    int16_t smax = -1;
    int16_t sabs;
    int16_t *sptr = in_vector;
    int16_t t;
    size_t looptimes = in_vector_length;

    for (i = looptimes; i > 0; i--)
    {
        sabs = (*sptr > 0 ? *sptr++ : -*sptr++);
        smax = (sabs > smax ? sabs : smax);
    }
    t = WebRtcSpl_NormW32(WEBRTC_SPL_MUL(smax, smax));

    if (smax == 0)
    {
        return 0; // Since norm(0) returns 0
    } else
    {
        return (t > nbits) ? 0 : nbits - t;
    }
}